

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O0

void __thiscall amrex::Amr::initPltAndChk(Amr *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool *ref;
  string *in_RDI;
  int chvInt;
  int phvInt;
  ParmParse pp;
  char *in_stack_000000d0;
  string *in_stack_ffffffffffffff30;
  ParmParse *this_00;
  int local_b0 [5];
  undefined1 local_99 [129];
  char *local_18;
  char *local_10;
  char *local_8;
  
  this_00 = (ParmParse *)local_99;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_99 + 1),"amr",(allocator *)this_00);
  ParmParse::ParmParse(this_00,in_RDI);
  std::__cxx11::string::~string((string *)(local_99 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_99);
  ParmParse::queryAdd<bool,_0>(this_00,(char *)in_RDI,(bool *)in_stack_ffffffffffffff30);
  ParmParse::queryAdd<bool,_0>(this_00,(char *)in_RDI,(bool *)in_stack_ffffffffffffff30);
  ParmParse::queryAdd<int,_0>(this_00,(char *)in_RDI,(int *)in_stack_ffffffffffffff30);
  ParmParse::queryAdd<int,_0>(this_00,(char *)in_RDI,(int *)in_stack_ffffffffffffff30);
  if ((anonymous_namespace)::plot_nfiles == -1) {
    (anonymous_namespace)::plot_nfiles = ParallelDescriptor::NProcs();
  }
  if ((anonymous_namespace)::checkpoint_nfiles == -1) {
    (anonymous_namespace)::checkpoint_nfiles = ParallelDescriptor::NProcs();
  }
  std::__cxx11::string::operator=((string *)(in_RDI[0x10].field_2._M_local_buf + 8),"chk");
  ParmParse::queryAdd(this_00,(char *)in_RDI,in_stack_ffffffffffffff30);
  *(undefined4 *)((long)&in_RDI[0x10]._M_string_length + 4) = 0xffffffff;
  ParmParse::queryAdd<int,_0>(this_00,(char *)in_RDI,(int *)in_stack_ffffffffffffff30);
  in_RDI[0x10].field_2._M_allocated_capacity = 0xbff0000000000000;
  ParmParse::queryAdd<double,_0>(this_00,(char *)in_RDI,(double *)in_stack_ffffffffffffff30);
  if (((0 < *(int *)((long)&in_RDI[0x10]._M_string_length + 4)) &&
      (0.0 < *(double *)&in_RDI[0x10].field_2)) &&
     (bVar3 = ParallelDescriptor::IOProcessor(), bVar3)) {
    local_8 = "Warning: both amr.check_int and amr.check_per are > 0.";
    Warning_host(in_stack_000000d0);
  }
  std::__cxx11::string::operator=((string *)(in_RDI + 0x14),"plt");
  ParmParse::queryAdd(this_00,(char *)in_RDI,in_stack_ffffffffffffff30);
  *(undefined4 *)(in_RDI + 0x12) = 0xffffffff;
  ParmParse::queryAdd<int,_0>(this_00,(char *)in_RDI,(int *)in_stack_ffffffffffffff30);
  in_RDI[0x12]._M_string_length = 0xbff0000000000000;
  ParmParse::queryAdd<double,_0>(this_00,(char *)in_RDI,(double *)in_stack_ffffffffffffff30);
  in_RDI[0x12].field_2._M_allocated_capacity = 0xbff0000000000000;
  ParmParse::queryAdd<double,_0>(this_00,(char *)in_RDI,(double *)in_stack_ffffffffffffff30);
  if (((0 < *(int *)(in_RDI + 0x12)) && (0.0 < (double)in_RDI[0x12]._M_string_length)) &&
     (bVar3 = ParallelDescriptor::IOProcessor(), bVar3)) {
    local_10 = "Warning: both amr.plot_int and amr.plot_per are > 0.";
    Warning_host(in_stack_000000d0);
  }
  std::__cxx11::string::operator=((string *)(in_RDI + 0x15),"smallplt");
  ParmParse::queryAdd(this_00,(char *)in_RDI,in_stack_ffffffffffffff30);
  *(undefined4 *)((long)&in_RDI[0x12].field_2 + 8) = 0xffffffff;
  ParmParse::queryAdd<int,_0>(this_00,(char *)in_RDI,(int *)in_stack_ffffffffffffff30);
  *(undefined8 *)(in_RDI + 0x13) = 0xbff0000000000000;
  ParmParse::queryAdd<double,_0>(this_00,(char *)in_RDI,(double *)in_stack_ffffffffffffff30);
  in_RDI[0x13]._M_string_length = 0xbff0000000000000;
  ParmParse::queryAdd<double,_0>(this_00,(char *)in_RDI,(double *)in_stack_ffffffffffffff30);
  if (((0 < *(int *)((long)&in_RDI[0x12].field_2 + 8)) && (0.0 < *(double *)(in_RDI + 0x13))) &&
     (bVar3 = ParallelDescriptor::IOProcessor(), bVar3)) {
    local_18 = "Warning: both amr.small_plot_int and amr.small_plot_per are > 0.";
    Warning_host(in_stack_000000d0);
  }
  *(undefined4 *)&in_RDI[0x13].field_2 = 1;
  ParmParse::queryAdd<int,_0>(this_00,(char *)in_RDI,(int *)in_stack_ffffffffffffff30);
  *(undefined4 *)((long)&in_RDI[0x4b].field_2 + 4) = 4;
  ParmParse::queryAdd<int,_0>(this_00,(char *)in_RDI,(int *)in_stack_ffffffffffffff30);
  local_b0[0] = 1;
  ref = (bool *)std::max<int>((int *)(in_RDI[0x4b].field_2._M_local_buf + 4),local_b0);
  *(undefined4 *)((long)&in_RDI[0x4b].field_2 + 4) = *(undefined4 *)ref;
  in_RDI[0x4b].field_2._M_local_buf[0] = '\0';
  ParmParse::queryAdd<bool,_0>(this_00,(char *)in_RDI,ref);
  ParmParse::queryAdd<bool,_0>(this_00,(char *)in_RDI,ref);
  ParmParse::queryAdd<bool,_0>(this_00,(char *)in_RDI,ref);
  iVar2 = (anonymous_namespace)::checkpoint_headerversion;
  iVar1 = (anonymous_namespace)::plot_headerversion;
  ParmParse::queryAdd<int,_0>(this_00,(char *)in_RDI,(int *)ref);
  if (iVar1 != (anonymous_namespace)::plot_headerversion) {
    (anonymous_namespace)::plot_headerversion = iVar1;
  }
  ParmParse::queryAdd<int,_0>(this_00,(char *)in_RDI,(int *)ref);
  if (iVar2 != (anonymous_namespace)::checkpoint_headerversion) {
    (anonymous_namespace)::checkpoint_headerversion = iVar2;
  }
  ParmParse::~ParmParse((ParmParse *)0x1380426);
  return;
}

Assistant:

void
Amr::initPltAndChk ()
{
    ParmParse pp("amr");

    pp.queryAdd("checkpoint_files_output", checkpoint_files_output);
    pp.queryAdd("plot_files_output", plot_files_output);

    pp.queryAdd("plot_nfiles", plot_nfiles);
    pp.queryAdd("checkpoint_nfiles", checkpoint_nfiles);
    //
    // -1 ==> use ParallelDescriptor::NProcs().
    //
    if (plot_nfiles       == -1) plot_nfiles       = ParallelDescriptor::NProcs();
    if (checkpoint_nfiles == -1) checkpoint_nfiles = ParallelDescriptor::NProcs();

    check_file_root = "chk";
    pp.queryAdd("check_file",check_file_root);

    check_int = -1;
    pp.queryAdd("check_int",check_int);

    check_per = -1.0;
    pp.queryAdd("check_per",check_per);

    if (check_int > 0 && check_per > 0)
    {
        if (ParallelDescriptor::IOProcessor())
            amrex::Warning("Warning: both amr.check_int and amr.check_per are > 0.");
    }

    plot_file_root = "plt";
    pp.queryAdd("plot_file",plot_file_root);

    plot_int = -1;
    pp.queryAdd("plot_int",plot_int);

    plot_per = -1.0;
    pp.queryAdd("plot_per",plot_per);

    plot_log_per = -1.0;
    pp.queryAdd("plot_log_per",plot_log_per);

    if (plot_int > 0 && plot_per > 0)
    {
        if (ParallelDescriptor::IOProcessor())
            amrex::Warning("Warning: both amr.plot_int and amr.plot_per are > 0.");
    }

    small_plot_file_root = "smallplt";
    pp.queryAdd("small_plot_file",small_plot_file_root);

    small_plot_int = -1;
    pp.queryAdd("small_plot_int",small_plot_int);

    small_plot_per = -1.0;
    pp.queryAdd("small_plot_per",small_plot_per);

    small_plot_log_per = -1.0;
    pp.queryAdd("small_plot_log_per",small_plot_log_per);

    if (small_plot_int > 0 && small_plot_per > 0)
    {
        if (ParallelDescriptor::IOProcessor())
            amrex::Warning("Warning: both amr.small_plot_int and amr.small_plot_per are > 0.");
    }

    write_plotfile_with_checkpoint = 1;
    pp.queryAdd("write_plotfile_with_checkpoint",write_plotfile_with_checkpoint);

    stream_max_tries = 4;
    pp.queryAdd("stream_max_tries",stream_max_tries);
    stream_max_tries = std::max(stream_max_tries, 1);

    abort_on_stream_retry_failure = false;
    pp.queryAdd("abort_on_stream_retry_failure",abort_on_stream_retry_failure);

    pp.queryAdd("precreateDirectories", precreateDirectories);
    pp.queryAdd("prereadFAHeaders", prereadFAHeaders);

    int phvInt(plot_headerversion), chvInt(checkpoint_headerversion);
    pp.queryAdd("plot_headerversion", phvInt);
    if(phvInt != plot_headerversion) {
      plot_headerversion = static_cast<VisMF::Header::Version> (phvInt);
    }
    pp.queryAdd("checkpoint_headerversion", chvInt);
    if(chvInt != checkpoint_headerversion) {
      checkpoint_headerversion = static_cast<VisMF::Header::Version> (chvInt);
    }
}